

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

void __thiscall
ON_PostEffects::GetPostEffects(ON_PostEffects *this,Types type,ON_SimpleArray<ON_PostEffect_*> *a)

{
  CImpl *this_00;
  Types TVar1;
  int i;
  long lVar2;
  ON_PostEffect *pep;
  ON_PostEffect *local_30;
  
  this_00 = this->_impl;
  CImpl::EnsurePopulated(this_00);
  for (lVar2 = 0; lVar2 < (this_00->_peps).m_count; lVar2 = lVar2 + 1) {
    local_30 = (this_00->_peps).m_a[lVar2];
    TVar1 = (*local_30->_vptr_ON_PostEffect[5])();
    if (TVar1 == type) {
      ON_SimpleArray<ON_PostEffect_*>::Append(a,&local_30);
    }
  }
  return;
}

Assistant:

void ON_PostEffects::GetPostEffects(ON_PostEffect::Types type, ON_SimpleArray<ON_PostEffect*>& a)
{
  const auto& pel = _impl->PostEffectList();

  for (int i = 0; i < pel.Count(); i++)
  {
    ON_PostEffect* pep = pel[i];
    if (pep->Type() == type)
      a.Append(pep);
  }
}